

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
::
nosize_unchecked_emplace_at<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>&&,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<std::tuple<slang::DiagCode,_slang::SourceLocation>_&&,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  tuple<slang::DiagCode,_slang::SourceLocation> *ptVar3;
  vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *pvVar4;
  uint uVar5;
  ushort uVar6;
  pointer pDVar7;
  ulong uVar8;
  value_type_pointer ppVar9;
  long lVar10;
  group_type_pointer pgVar11;
  undefined1 auVar12 [16];
  
  pgVar11 = __return_storage_ptr__->pg;
  uVar8 = (ulong)__return_storage_ptr__->n;
  ppVar9 = __return_storage_ptr__->p;
  lVar10 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar12[0] = -(pgVar2->m[0].n == '\0');
    auVar12[1] = -(pgVar2->m[1].n == '\0');
    auVar12[2] = -(pgVar2->m[2].n == '\0');
    auVar12[3] = -(pgVar2->m[3].n == '\0');
    auVar12[4] = -(pgVar2->m[4].n == '\0');
    auVar12[5] = -(pgVar2->m[5].n == '\0');
    auVar12[6] = -(pgVar2->m[6].n == '\0');
    auVar12[7] = -(pgVar2->m[7].n == '\0');
    auVar12[8] = -(pgVar2->m[8].n == '\0');
    auVar12[9] = -(pgVar2->m[9].n == '\0');
    auVar12[10] = -(pgVar2->m[10].n == '\0');
    auVar12[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar12[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar12[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar12[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar12[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar6 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe;
    if (uVar6 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar5 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar8 = (ulong)uVar5;
      ppVar9 = arrays_->elements_ + pos0 * 0xf + uVar8;
      ptVar3 = args->first;
      (ppVar9->first).super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
      super__Tuple_impl<1UL,_slang::SourceLocation>.
      super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl =
           (ptVar3->super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>).
           super__Tuple_impl<1UL,_slang::SourceLocation>.
           super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl;
      (ppVar9->first).super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
      super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl =
           (ptVar3->super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>).
           super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl;
      pvVar4 = args->second;
      pDVar7 = (pvVar4->super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      (ppVar9->second).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pvVar4->super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>).
           _M_impl.super__Vector_impl_data._M_start;
      (ppVar9->second).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
      _M_impl.super__Vector_impl_data._M_finish = pDVar7;
      (ppVar9->second).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pvVar4->super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pvVar4->super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar4->super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar4->super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pgVar1->m[uVar8].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar11 = pgVar1;
    }
    if (uVar6 != 0) break;
    pos0 = pos0 + lVar10 & arrays_->groups_size_mask;
    lVar10 = lVar10 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar8;
  __return_storage_ptr__->p = ppVar9;
  __return_storage_ptr__->pg = pgVar11;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }